

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_unitAttributeMultiplier_Test::TestBody(Units_unitAttributeMultiplier_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  double local_78;
  allocator<char> local_69;
  double local_68 [4];
  AssertionResult gtest_ar;
  UnitsPtr u;
  
  libcellml::Units::create();
  local_68[0] = 1.0;
  local_78 = (double)libcellml::Units::unitAttributeMultiplier
                               ((ulong)u.
                                       super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.0","u->unitAttributeMultiplier(0)",local_68,&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x33d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  peVar1 = u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"NewUnit",(allocator<char> *)&local_78);
  pcVar2 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"",&local_69);
  libcellml::Units::addUnit((string *)peVar1,(int)&gtest_ar,1.05,17.0,(string *)0x4);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_68[0] = 17.0;
  local_78 = (double)libcellml::Units::unitAttributeMultiplier
                               ((ulong)u.
                                       super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"17.0","u->unitAttributeMultiplier(0)",local_68,&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_68);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x340,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_68[0] = 1.0;
  local_78 = (double)libcellml::Units::unitAttributeMultiplier
                               ((ulong)u.
                                       super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"1.0","u->unitAttributeMultiplier(5)",local_68,&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x341,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, unitAttributeMultiplier)
{
    libcellml::UnitsPtr u = libcellml::Units::create();

    EXPECT_EQ(1.0, u->unitAttributeMultiplier(0));
    u->addUnit("NewUnit", 4, 1.05, 17.0);

    EXPECT_EQ(17.0, u->unitAttributeMultiplier(0));
    EXPECT_EQ(1.0, u->unitAttributeMultiplier(5));
}